

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

int Abc_NtkDemiter(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  void *pvVar4;
  int local_58;
  uint local_54;
  int i;
  int nCommon;
  Vec_Ptr_t *vNodes2;
  Vec_Ptr_t *vNodes1;
  Abc_Obj_t *pPoNew;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNodeB;
  Abc_Obj_t *pNodeA;
  Abc_Obj_t *pNodeC;
  Abc_Ntk_t *pNtk_local;
  
  pNodeC = (Abc_Obj_t *)pNtk;
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x445,"int Abc_NtkDemiter(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)pNodeC);
  if (iVar1 != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x446,"int Abc_NtkDemiter(Abc_Ntk_t *)");
  }
  pAVar2 = Abc_NtkPo((Abc_Ntk_t *)pNodeC,0);
  pAVar2 = Abc_ObjFanin0(pAVar2);
  iVar1 = Abc_NodeIsExorType(pAVar2);
  if (iVar1 == 0) {
    printf("The root of the miter is not an EXOR gate.\n");
    pNtk_local._4_4_ = 0;
  }
  else {
    pAVar2 = Abc_NtkPo((Abc_Ntk_t *)pNodeC,0);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    pNodeA = Abc_NodeRecognizeMux(pAVar2,&pNodeB,&pNode);
    pAVar2 = Abc_ObjRegular(pNodeB);
    pAVar3 = Abc_ObjRegular(pNode);
    if (pAVar2 != pAVar3) {
      __assert_fail("Abc_ObjRegular(pNodeA) == Abc_ObjRegular(pNodeB)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                    ,0x44d,"int Abc_NtkDemiter(Abc_Ntk_t *)");
    }
    pAVar2 = Abc_NtkPo((Abc_Ntk_t *)pNodeC,0);
    iVar1 = Abc_ObjFaninC0(pAVar2);
    if (iVar1 != 0) {
      pNodeB = Abc_ObjNot(pNodeB);
      pNode = Abc_ObjNot(pNode);
    }
    pAVar2 = Abc_NtkCreatePo((Abc_Ntk_t *)pNodeC);
    Abc_ObjAddFanin(pAVar2,pNodeA);
    Abc_ObjAssignName(pAVar2,"addOut1",(char *)0x0);
    pAVar2 = Abc_NtkCreatePo((Abc_Ntk_t *)pNodeC);
    Abc_ObjAddFanin(pAVar2,pNode);
    Abc_ObjAssignName(pAVar2,"addOut2",(char *)0x0);
    pNode = Abc_ObjRegular(pNode);
    p = Abc_NtkDfsNodes((Abc_Ntk_t *)pNodeC,&pNodeA,1);
    p_00 = Abc_NtkDfsNodes((Abc_Ntk_t *)pNodeC,&pNode,1);
    for (local_58 = 0; iVar1 = Vec_PtrSize(p), local_58 < iVar1; local_58 = local_58 + 1) {
      pvVar4 = Vec_PtrEntry(p,local_58);
      *(uint *)((long)pvVar4 + 0x14) = *(uint *)((long)pvVar4 + 0x14) & 0xffffffef | 0x10;
    }
    local_54 = 0;
    for (local_58 = 0; iVar1 = Vec_PtrSize(p_00), local_58 < iVar1; local_58 = local_58 + 1) {
      pvVar4 = Vec_PtrEntry(p_00,local_58);
      local_54 = (*(uint *)((long)pvVar4 + 0x14) >> 4 & 1) + local_54;
    }
    for (local_58 = 0; iVar1 = Vec_PtrSize(p), local_58 < iVar1; local_58 = local_58 + 1) {
      pvVar4 = Vec_PtrEntry(p,local_58);
      *(uint *)((long)pvVar4 + 0x14) = *(uint *)((long)pvVar4 + 0x14) & 0xffffffef;
    }
    printf("First cone = %6d.  Second cone = %6d.  Common = %6d.\n",(ulong)(uint)p->nSize,
           (ulong)(uint)p_00->nSize,(ulong)local_54);
    Vec_PtrFree(p);
    Vec_PtrFree(p_00);
    Abc_NtkOrderCisCos((Abc_Ntk_t *)pNodeC);
    iVar1 = Abc_NtkCheck((Abc_Ntk_t *)pNodeC);
    if (iVar1 == 0) {
      printf("Abc_NtkDemiter: The network check has failed.\n");
    }
    pNtk_local._4_4_ = 1;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkDemiter( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNodeC, * pNodeA, * pNodeB, * pNode;
    Abc_Obj_t * pPoNew;
    Vec_Ptr_t * vNodes1, * vNodes2;
    int nCommon, i;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    if ( !Abc_NodeIsExorType(Abc_ObjFanin0(Abc_NtkPo(pNtk,0))) )
    {
        printf( "The root of the miter is not an EXOR gate.\n" );
        return 0;
    }
    pNodeC = Abc_NodeRecognizeMux( Abc_ObjFanin0(Abc_NtkPo(pNtk,0)), &pNodeA, &pNodeB );
    assert( Abc_ObjRegular(pNodeA) == Abc_ObjRegular(pNodeB) );
    if ( Abc_ObjFaninC0(Abc_NtkPo(pNtk,0)) )
    {
        pNodeA = Abc_ObjNot(pNodeA);
        pNodeB = Abc_ObjNot(pNodeB);
    }

    // add the PO corresponding to control input
    pPoNew = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pPoNew, pNodeC );
    Abc_ObjAssignName( pPoNew, "addOut1", NULL );

    // add the PO corresponding to other input
    pPoNew = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pPoNew, pNodeB );
    Abc_ObjAssignName( pPoNew, "addOut2", NULL );

    // mark the nodes in the first cone
    pNodeB = Abc_ObjRegular(pNodeB);
    vNodes1 = Abc_NtkDfsNodes( pNtk, &pNodeC, 1 );
    vNodes2 = Abc_NtkDfsNodes( pNtk, &pNodeB, 1 );

    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode, i )
        pNode->fMarkA = 1;
    nCommon = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes2, pNode, i )
        nCommon += pNode->fMarkA;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode, i )
        pNode->fMarkA = 0;

    printf( "First cone = %6d.  Second cone = %6d.  Common = %6d.\n", vNodes1->nSize, vNodes2->nSize, nCommon );
    Vec_PtrFree( vNodes1 );
    Vec_PtrFree( vNodes2 );

    // reorder the latches
    Abc_NtkOrderCisCos( pNtk );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
        printf( "Abc_NtkDemiter: The network check has failed.\n" );
    return 1;
}